

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void anon_unknown.dwarf_d1289::ReadChannelInfo
               (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                *channels,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  bool bVar1;
  pointer *ptr;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  *this;
  string *in_RSI;
  ChannelInfo info;
  char *p;
  size_type in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  value_type *__x;
  value_type local_48;
  
  ptr = (pointer *)
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
  while (*(value_type *)ptr != '\0') {
    __x = &local_48;
    anon_struct_48_5_91bcb76e::ChannelInfo((anon_struct_48_5_91bcb76e *)0x1926a2);
    this = (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            *)ReadString(in_RSI,(char *)ptr);
    local_48.pixelType =
         *(int *)&(this->
                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    local_48.pLinear =
         *(uchar *)((long)&(this->
                           super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                           )._M_impl.super__Vector_impl_data._M_start + 4);
    local_48.xSampling =
         *(int *)&(this->
                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_48.ySampling =
         *(int *)((long)&(this->
                         super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                         )._M_impl.super__Vector_impl_data._M_finish + 4);
    ptr = &(this->
           super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
    bVar1 = IsBigEndian();
    if (bVar1) {
      swap4((uint *)&local_48.pixelType);
      swap4((uint *)&local_48.xSampling);
      swap4((uint *)&local_48.ySampling);
    }
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::push_back(this,__x);
    anon_struct_48_5_91bcb76e::~ChannelInfo((anon_struct_48_5_91bcb76e *)0x192796);
  }
  return;
}

Assistant:

void ReadChannelInfo(std::vector<ChannelInfo> &channels,
                     const std::vector<unsigned char> &data) {
  const char *p = reinterpret_cast<const char *>(&data.at(0));

  for (;;) {
    if ((*p) == 0) {
      break;
    }
    ChannelInfo info;
    p = ReadString(info.name, p);

    memcpy(&info.pixelType, p, sizeof(int));
    p += 4;
    info.pLinear = p[0];                     // uchar
    p += 1 + 3;                              // reserved: uchar[3]
    memcpy(&info.xSampling, p, sizeof(int)); // int
    p += 4;
    memcpy(&info.ySampling, p, sizeof(int)); // int
    p += 4;

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&info.pixelType));
      swap4(reinterpret_cast<unsigned int *>(&info.xSampling));
      swap4(reinterpret_cast<unsigned int *>(&info.ySampling));
    }

    channels.push_back(info);
  }
}